

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_tests.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  PerformanceTestFramework framework;
  PerformanceTestFramework *in_stack_00000090;
  PerformanceTestFramework *in_stack_000000d0;
  PerformanceTestFramework *in_stack_00000250;
  char **in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  
  Test_Helper::setRunCount(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,0);
  PerformanceTestFramework::PerformanceTestFramework((PerformanceTestFramework *)0x16d586);
  addTests_Blob_Detection(in_stack_00000090);
  addTests_Filtering(in_stack_00000250);
  addTests_Image_Function((PerformanceTestFramework *)0x16d5a7);
  PerformanceTestFramework::run(in_stack_000000d0);
  PerformanceTestFramework::~PerformanceTestFramework((PerformanceTestFramework *)0x16d5c7);
  return 0;
}

Assistant:

int main( int argc, char* argv[] )
{
    // The main purpose of this application is to test everything within library
    // To do this we need an engine (framework) and a bunch of tests
    Performance_Test::setRunCount( argc, argv, 128 );

    // We create a framework
    PerformanceTestFramework framework;

    // We add tests
    addTests_Blob_Detection     ( framework );
    addTests_Filtering          ( framework );
    addTests_Image_Function     ( framework );

    // Just run the framework what will handle all tests
    framework.run();

    return 0;
}